

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_mem.cc
# Opt level: O0

BIO * BIO_new_mem_buf(void *buf,int len)

{
  size_t *psVar1;
  BIO_METHOD *type;
  int in_register_00000034;
  size_t local_40;
  size_t size;
  BUF_MEM *b;
  BIO *ret;
  ossl_ssize_t len_local;
  void *buf_local;
  
  local_40 = CONCAT44(in_register_00000034,len);
  if (in_register_00000034 < 0) {
    local_40 = strlen((char *)buf);
  }
  if ((buf == (void *)0x0) && (CONCAT44(in_register_00000034,len) != 0)) {
    ERR_put_error(0x11,0,0x6f,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_mem.cc"
                  ,0x21);
    buf_local = (void *)0x0;
  }
  else {
    type = BIO_s_mem();
    buf_local = BIO_new(type);
    if ((BIO *)buf_local == (BIO *)0x0) {
      buf_local = (void *)0x0;
    }
    else {
      psVar1 = *(size_t **)&((BIO *)buf_local)->num;
      psVar1[1] = (size_t)buf;
      *psVar1 = local_40;
      psVar1[2] = local_40;
      ((BIO *)buf_local)->init = ((BIO *)buf_local)->init | 0x200;
      ((BIO *)buf_local)->flags = 0;
    }
  }
  return (BIO *)buf_local;
}

Assistant:

BIO *BIO_new_mem_buf(const void *buf, ossl_ssize_t len) {
  BIO *ret;
  BUF_MEM *b;
  const size_t size = len < 0 ? strlen((char *)buf) : (size_t)len;

  if (!buf && len != 0) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_NULL_PARAMETER);
    return NULL;
  }

  ret = BIO_new(BIO_s_mem());
  if (ret == NULL) {
    return NULL;
  }

  b = (BUF_MEM *)ret->ptr;
  // BIO_FLAGS_MEM_RDONLY ensures |b->data| is not written to.
  b->data = reinterpret_cast<char *>(const_cast<void *>(buf));
  b->length = size;
  b->max = size;

  ret->flags |= BIO_FLAGS_MEM_RDONLY;

  // |num| is used to store the value that this BIO will return when it runs
  // out of data. If it's negative then the retry flags will also be set. Since
  // this is static data, retrying wont help
  ret->num = 0;

  return ret;
}